

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

ALLEGRO_DISPLAY * al_get_current_display(void)

{
  thread_local_state *ptVar1;
  thread_local_state *tls;
  ALLEGRO_DISPLAY *local_8;
  
  ptVar1 = tls_get();
  if (ptVar1 == (thread_local_state *)0x0) {
    local_8 = (ALLEGRO_DISPLAY *)0x0;
  }
  else {
    local_8 = ptVar1->current_display;
  }
  return local_8;
}

Assistant:

ALLEGRO_DISPLAY *al_get_current_display(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return NULL;
   return tls->current_display;
}